

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_vui_parameters(sps_t *sps,bs_t *b)

{
  byte *pbVar1;
  uint32_t r;
  int iVar2;
  int iVar3;
  uint32_t r_8;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  pbVar1 = b->end;
  uVar7 = 0;
  if (pbVar6 < pbVar1) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).aspect_ratio_info_present_flag = uVar7;
  if (uVar7 != 0) {
    uVar7 = b->bits_left;
    if ((uVar7 == 8) && (pbVar6 = b->p, pbVar6 < pbVar1)) {
      uVar4 = (uint)*pbVar6;
      b->p = pbVar6 + 1;
    }
    else {
      pbVar6 = b->p;
      uVar4 = 0;
      iVar2 = 7;
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
        bVar10 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar10);
    }
    (sps->vui).aspect_ratio_idc = uVar4;
    if (uVar4 == 0xff) {
      uVar7 = b->bits_left;
      pbVar6 = b->p;
      uVar4 = 0;
      iVar2 = 0xf;
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
        bVar10 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar10);
      (sps->vui).sar_width = uVar4;
      uVar7 = b->bits_left;
      pbVar6 = b->p;
      uVar4 = 0;
      iVar2 = 0xf;
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
        bVar10 = iVar2 != 0;
        iVar2 = iVar2 + -1;
      } while (bVar10);
      (sps->vui).sar_height = uVar4;
    }
  }
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  uVar7 = 0;
  if (pbVar6 < pbVar1) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).overscan_info_present_flag = uVar7;
  if (uVar7 != 0) {
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar6 = b->p;
    uVar7 = 0;
    if (pbVar6 < pbVar1) {
      uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar6 + 1;
      b->bits_left = 8;
    }
    (sps->vui).overscan_appropriate_flag = uVar7;
  }
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  uVar7 = 0;
  if (pbVar6 < pbVar1) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).video_signal_type_present_flag = uVar7;
  if (uVar7 != 0) {
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    uVar4 = 0;
    iVar2 = 2;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar8 = 0;
      if (pbVar6 < pbVar1) {
        uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
      bVar10 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar10);
    (sps->vui).video_format = uVar4;
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar6 = b->p;
    uVar7 = 0;
    if (pbVar6 < pbVar1) {
      uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar6 + 1;
      b->bits_left = 8;
    }
    (sps->vui).video_full_range_flag = uVar7;
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar6 = b->p;
    uVar7 = 0;
    if (pbVar6 < pbVar1) {
      uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar6 + 1;
      b->bits_left = 8;
    }
    (sps->vui).colour_description_present_flag = uVar7;
    if (uVar7 != 0) {
      uVar7 = b->bits_left;
      if ((uVar7 == 8) && (pbVar6 = b->p, pbVar6 < pbVar1)) {
        uVar4 = (uint)*pbVar6;
        b->p = pbVar6 + 1;
      }
      else {
        pbVar6 = b->p;
        uVar4 = 0;
        iVar2 = 7;
        do {
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          uVar8 = 0;
          if (pbVar6 < pbVar1) {
            uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar6 = pbVar6 + 1;
            b->p = pbVar6;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
          bVar10 = iVar2 != 0;
          iVar2 = iVar2 + -1;
        } while (bVar10);
      }
      (sps->vui).colour_primaries = uVar4;
      uVar7 = b->bits_left;
      if ((uVar7 == 8) && (pbVar6 = b->p, pbVar6 < pbVar1)) {
        uVar4 = (uint)*pbVar6;
        b->p = pbVar6 + 1;
      }
      else {
        pbVar6 = b->p;
        uVar4 = 0;
        iVar2 = 7;
        do {
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          uVar8 = 0;
          if (pbVar6 < pbVar1) {
            uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar6 = pbVar6 + 1;
            b->p = pbVar6;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
          bVar10 = iVar2 != 0;
          iVar2 = iVar2 + -1;
        } while (bVar10);
      }
      (sps->vui).transfer_characteristics = uVar4;
      uVar7 = b->bits_left;
      if ((uVar7 == 8) && (pbVar6 = b->p, pbVar6 < pbVar1)) {
        uVar4 = (uint)*pbVar6;
        b->p = pbVar6 + 1;
      }
      else {
        pbVar6 = b->p;
        uVar4 = 0;
        iVar2 = 7;
        do {
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          uVar8 = 0;
          if (pbVar6 < pbVar1) {
            uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar6 = pbVar6 + 1;
            b->p = pbVar6;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
          bVar10 = iVar2 != 0;
          iVar2 = iVar2 + -1;
        } while (bVar10);
      }
      (sps->vui).matrix_coefficients = uVar4;
    }
  }
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  uVar7 = 0;
  if (pbVar6 < pbVar1) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).chroma_loc_info_present_flag = uVar7;
  if (uVar7 != 0) {
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    uVar4 = 0xffffffff;
    iVar2 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar2 = iVar2 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    iVar5 = 0;
    uVar7 = 0;
    if (iVar2 != -1) {
      iVar3 = -2 - iVar2;
      iVar9 = -3 - iVar2;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar3 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar9 != -2);
    }
    uVar4 = 0xffffffff;
    (sps->vui).chroma_sample_loc_type_top_field = ~(-1 << (~(byte)iVar2 & 0x1f)) + uVar7;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    if (iVar5 == -1) {
      uVar7 = 0;
    }
    else {
      iVar2 = -2 - iVar5;
      iVar3 = -3 - iVar5;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar2 & 0x1f);
        iVar3 = iVar3 + -1;
        iVar2 = iVar2 + -1;
      } while (iVar3 != -2);
    }
    (sps->vui).chroma_sample_loc_type_bottom_field = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar7;
  }
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  uVar7 = 0;
  if (pbVar6 < pbVar1) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).timing_info_present_flag = uVar7;
  if (uVar7 != 0) {
    pbVar6 = b->p;
    pbVar1 = b->end;
    uVar7 = b->bits_left;
    uVar4 = 0;
    iVar2 = 0x1f;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar8 = 0;
      if (pbVar6 < pbVar1) {
        uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
      bVar10 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar10);
    (sps->vui).num_units_in_tick = uVar4;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    uVar4 = 0;
    iVar2 = 0x1f;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar8 = 0;
      if (pbVar6 < pbVar1) {
        uVar8 = (uint)((*pbVar6 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 | uVar8 << ((byte)iVar2 & 0x1f);
      bVar10 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while (bVar10);
    (sps->vui).time_scale = uVar4;
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar6 = b->p;
    uVar7 = 0;
    if (pbVar6 < pbVar1) {
      uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar6 + 1;
      b->bits_left = 8;
    }
    (sps->vui).fixed_frame_rate_flag = uVar7;
  }
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  uVar7 = 0;
  if (pbVar6 < b->end) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).nal_hrd_parameters_present_flag = uVar7;
  if (uVar7 != 0) {
    read_hrd_parameters(&sps->hrd_nal,b);
  }
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  uVar7 = 0;
  if (pbVar6 < b->end) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).vcl_hrd_parameters_present_flag = uVar7;
  if (uVar7 != 0) {
    read_hrd_parameters(&sps->hrd_vcl,b);
  }
  if (((sps->vui).nal_hrd_parameters_present_flag != 0) ||
     ((sps->vui).vcl_hrd_parameters_present_flag != 0)) {
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar6 = b->p;
    uVar7 = 0;
    if (pbVar6 < b->end) {
      uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar6 + 1;
      b->bits_left = 8;
    }
    (sps->vui).low_delay_hrd_flag = uVar7;
  }
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  pbVar1 = b->end;
  uVar7 = 0;
  if (pbVar6 < pbVar1) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).pic_struct_present_flag = uVar7;
  uVar4 = b->bits_left - 1;
  b->bits_left = uVar4;
  pbVar6 = b->p;
  uVar7 = 0;
  if (pbVar6 < pbVar1) {
    uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
  }
  if (uVar4 == 0) {
    b->p = pbVar6 + 1;
    b->bits_left = 8;
  }
  (sps->vui).bitstream_restriction_flag = uVar7;
  if (uVar7 != 0) {
    uVar4 = b->bits_left - 1;
    b->bits_left = uVar4;
    pbVar6 = b->p;
    uVar7 = 0;
    if (pbVar6 < pbVar1) {
      uVar7 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
    }
    if (uVar4 == 0) {
      b->p = pbVar6 + 1;
      b->bits_left = 8;
    }
    (sps->vui).motion_vectors_over_pic_boundaries_flag = uVar7;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    uVar4 = 0xffffffff;
    iVar2 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar2 = iVar2 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    iVar5 = 0;
    uVar7 = 0;
    if (iVar2 != -1) {
      iVar3 = -2 - iVar2;
      iVar9 = -3 - iVar2;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar3 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar9 != -2);
    }
    uVar4 = 0xffffffff;
    (sps->vui).max_bytes_per_pic_denom = ~(-1 << (~(byte)iVar2 & 0x1f)) + uVar7;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    iVar2 = 0;
    uVar7 = 0;
    if (iVar5 != -1) {
      iVar3 = -2 - iVar5;
      iVar9 = -3 - iVar5;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar3 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar9 != -2);
    }
    uVar4 = 0xffffffff;
    (sps->vui).max_bits_per_mb_denom = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar7;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar2 = iVar2 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    iVar5 = 0;
    uVar7 = 0;
    if (iVar2 != -1) {
      iVar3 = -2 - iVar2;
      iVar9 = -3 - iVar2;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar3 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar9 != -2);
    }
    uVar4 = 0xffffffff;
    (sps->vui).log2_max_mv_length_horizontal = ~(-1 << (~(byte)iVar2 & 0x1f)) + uVar7;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    iVar2 = 0;
    uVar7 = 0;
    if (iVar5 != -1) {
      iVar3 = -2 - iVar5;
      iVar9 = -3 - iVar5;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar3 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar9 != -2);
    }
    uVar4 = 0xffffffff;
    (sps->vui).log2_max_mv_length_vertical = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar7;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar2 = iVar2 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    iVar5 = 0;
    uVar7 = 0;
    if (iVar2 != -1) {
      iVar3 = -2 - iVar2;
      iVar9 = -3 - iVar2;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar3 & 0x1f);
        iVar9 = iVar9 + -1;
        iVar3 = iVar3 + -1;
      } while (iVar9 != -2);
    }
    uVar4 = 0xffffffff;
    (sps->vui).num_reorder_frames = ~(-1 << (~(byte)iVar2 & 0x1f)) + uVar7;
    uVar7 = b->bits_left;
    pbVar6 = b->p;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar10 = true;
      if (pbVar6 < pbVar1) {
        bVar10 = (*pbVar6 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar6 = pbVar6 + 1;
        b->p = pbVar6;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar10 & uVar4 < 0x20)) && (pbVar6 < pbVar1));
    if (iVar5 == -1) {
      uVar7 = 0;
    }
    else {
      iVar2 = -2 - iVar5;
      iVar3 = -3 - iVar5;
      uVar4 = b->bits_left;
      pbVar6 = b->p;
      uVar7 = 0;
      do {
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        uVar8 = 0;
        if (pbVar6 < pbVar1) {
          uVar8 = (uint)((*pbVar6 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar6 = pbVar6 + 1;
          b->p = pbVar6;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar7 | uVar8 << ((byte)iVar2 & 0x1f);
        iVar3 = iVar3 + -1;
        iVar2 = iVar2 + -1;
      } while (iVar3 != -2);
    }
    (sps->vui).max_dec_frame_buffering = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar7;
  }
  return;
}

Assistant:

void read_vui_parameters(sps_t* sps, bs_t* b)
{
    sps->vui.aspect_ratio_info_present_flag = bs_read_u1(b);
    if( sps->vui.aspect_ratio_info_present_flag )
    {
        sps->vui.aspect_ratio_idc = bs_read_u8(b);
        if( sps->vui.aspect_ratio_idc == SAR_Extended )
        {
            sps->vui.sar_width = bs_read_u(b, 16);
            sps->vui.sar_height = bs_read_u(b, 16);
        }
    }
    sps->vui.overscan_info_present_flag = bs_read_u1(b);
    if( sps->vui.overscan_info_present_flag )
    {
        sps->vui.overscan_appropriate_flag = bs_read_u1(b);
    }
    sps->vui.video_signal_type_present_flag = bs_read_u1(b);
    if( sps->vui.video_signal_type_present_flag )
    {
        sps->vui.video_format = bs_read_u(b, 3);
        sps->vui.video_full_range_flag = bs_read_u1(b);
        sps->vui.colour_description_present_flag = bs_read_u1(b);
        if( sps->vui.colour_description_present_flag )
        {
            sps->vui.colour_primaries = bs_read_u8(b);
            sps->vui.transfer_characteristics = bs_read_u8(b);
            sps->vui.matrix_coefficients = bs_read_u8(b);
        }
    }
    sps->vui.chroma_loc_info_present_flag = bs_read_u1(b);
    if( sps->vui.chroma_loc_info_present_flag )
    {
        sps->vui.chroma_sample_loc_type_top_field = bs_read_ue(b);
        sps->vui.chroma_sample_loc_type_bottom_field = bs_read_ue(b);
    }
    sps->vui.timing_info_present_flag = bs_read_u1(b);
    if( sps->vui.timing_info_present_flag )
    {
        sps->vui.num_units_in_tick = bs_read_u(b, 32);
        sps->vui.time_scale = bs_read_u(b, 32);
        sps->vui.fixed_frame_rate_flag = bs_read_u1(b);
    }
    sps->vui.nal_hrd_parameters_present_flag = bs_read_u1(b);
    if( sps->vui.nal_hrd_parameters_present_flag )
    {
        read_hrd_parameters(&sps->hrd_nal, b);
    }
    sps->vui.vcl_hrd_parameters_present_flag = bs_read_u1(b);
    if( sps->vui.vcl_hrd_parameters_present_flag )
    {
        read_hrd_parameters(&sps->hrd_vcl, b);
    }
    if( sps->vui.nal_hrd_parameters_present_flag || sps->vui.vcl_hrd_parameters_present_flag )
    {
        sps->vui.low_delay_hrd_flag = bs_read_u1(b);
    }
    sps->vui.pic_struct_present_flag = bs_read_u1(b);
    sps->vui.bitstream_restriction_flag = bs_read_u1(b);
    if( sps->vui.bitstream_restriction_flag )
    {
        sps->vui.motion_vectors_over_pic_boundaries_flag = bs_read_u1(b);
        sps->vui.max_bytes_per_pic_denom = bs_read_ue(b);
        sps->vui.max_bits_per_mb_denom = bs_read_ue(b);
        sps->vui.log2_max_mv_length_horizontal = bs_read_ue(b);
        sps->vui.log2_max_mv_length_vertical = bs_read_ue(b);
        sps->vui.num_reorder_frames = bs_read_ue(b);
        sps->vui.max_dec_frame_buffering = bs_read_ue(b);
    }
}